

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage2d_max_level
               (NegativeTestContext *ctx)

{
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  int faceIterTcu;
  CubeFace CVar4;
  int faceIterTcu_1;
  allocator<char> local_49;
  string local_48;
  GLuint textures [2];
  
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,textures);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,textures[0]);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,textures[1]);
  for (CVar4 = CUBEFACE_NEGATIVE_X; CVar4 != CUBEFACE_LAST; CVar4 = CVar4 + CUBEFACE_POSITIVE_X) {
    dVar1 = cubeFaceToGLFace(CVar4);
    glu::CallLogWrapper::glTexImage2D
              (&ctx->super_CallLogWrapper,dVar1,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE) for 2D texture targets."
             ,&local_49);
  NegativeTestContext::beginSection(ctx,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  uVar2 = NegativeTestContext::getInteger(ctx,0xd33);
  uVar3 = 0x20;
  if (uVar2 != 0) {
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  glu::CallLogWrapper::glCopyTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0x20 - uVar3,0,0,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_SIZE) for cubemap targets."
             ,&local_49);
  NegativeTestContext::beginSection(ctx,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  uVar2 = NegativeTestContext::getInteger(ctx,0x851c);
  uVar3 = 0x20;
  if (uVar2 != 0) {
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  for (CVar4 = CUBEFACE_NEGATIVE_X; CVar4 != CUBEFACE_LAST; CVar4 = CVar4 + CUBEFACE_POSITIVE_X) {
    dVar1 = cubeFaceToGLFace(CVar4);
    glu::CallLogWrapper::glCopyTexSubImage2D
              (&ctx->super_CallLogWrapper,dVar1,0x20 - uVar3,0,0,0,0,4,4);
    NegativeTestContext::expectError(ctx,0x501);
  }
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,2,textures);
  return;
}

Assistant:

void copytexsubimage2d_max_level (NegativeTestContext& ctx)
{
	GLuint textures[2];
	ctx.glGenTextures	(2, &textures[0]);
	ctx.glBindTexture	(GL_TEXTURE_2D, textures[0]);
	ctx.glTexImage2D	(GL_TEXTURE_2D, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture	(GL_TEXTURE_CUBE_MAP, textures[1]);
	FOR_CUBE_FACES(faceGL, ctx.glTexImage2D(faceGL, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0););

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE) for 2D texture targets.");
	deUint32 log2MaxTextureSize = deLog2Floor32(ctx.getInteger(GL_MAX_TEXTURE_SIZE)) + 1;
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, log2MaxTextureSize, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_SIZE) for cubemap targets.");
	deUint32 log2MaxCubemapSize = deLog2Floor32(ctx.getInteger(GL_MAX_CUBE_MAP_TEXTURE_SIZE)) + 1;
	FOR_CUBE_FACES(faceGL,
	{
		ctx.glCopyTexSubImage2D(faceGL, log2MaxCubemapSize, 0, 0, 0, 0, 4, 4);
		ctx.expectError(GL_INVALID_VALUE);
	});
	ctx.endSection();

	ctx.glDeleteTextures(2, &textures[0]);
}